

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O0

void Ssw_ManBuildCone_rec(Ssw_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                  ,0x8b,"void Ssw_ManBuildCone_rec(Ssw_Man_t *, Aig_Obj_t *)");
  }
  pAVar2 = Ssw_ObjFrame(p,pObj,0);
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                    ,0x8e,"void Ssw_ManBuildCone_rec(Ssw_Man_t *, Aig_Obj_t *)");
    }
    pAVar2 = Aig_ObjFanin0(pObj);
    Ssw_ManBuildCone_rec(p,pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Ssw_ManBuildCone_rec(p,pAVar2);
    p_00 = p->pFrames;
    pAVar2 = Ssw_ObjChild0Fra(p,pObj,0);
    p1 = Ssw_ObjChild1Fra(p,pObj,0);
    pAVar2 = Aig_And(p_00,pAVar2,p1);
    Ssw_ObjSetFrame(p,pObj,0,pAVar2);
  }
  return;
}

Assistant:

void Ssw_ManBuildCone_rec( Ssw_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew;
    assert( !Aig_IsComplement(pObj) );
    if ( Ssw_ObjFrame( p, pObj, 0 ) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObj) );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin1(pObj) );
    pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, 0), Ssw_ObjChild1Fra(p, pObj, 0) );
    Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
}